

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcc.hpp
# Opt level: O0

void * __thiscall cppjit::builder::gcc::compile_impl(gcc *this)

{
  ostream *poVar1;
  char *pcVar2;
  cppjit_exception *pcVar3;
  void *pvVar4;
  duration<long,_std::ratio<1L,_1000000000L>_> local_7e8;
  duration<double,_std::ratio<1L,_1L>_> local_7e0;
  double local_7d8;
  double link_duration;
  time_point link_end;
  string local_7c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_780 [32];
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_760;
  time_point link_start;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_678 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8 [8];
  string link_cmd;
  duration<long,_std::ratio<1L,_1000000000L>_> local_598;
  duration<double,_std::ratio<1L,_1L>_> local_590;
  double local_588;
  double compile_duration;
  time_point compile_end;
  string local_570 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530 [36];
  int local_50c;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_508;
  int return_value;
  time_point compile_start;
  ostream local_4e0 [8];
  ofstream kernel_header_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120 [8];
  string compile_cmd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0 [8];
  string library_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [8];
  string object_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30 [8];
  string source_file;
  gcc *this_local;
  
  std::operator+(local_50,&(this->super_builder).source_dir);
  std::operator+(local_30,(char *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  std::operator+(local_a0,&(this->super_builder).compile_dir);
  std::operator+(local_80,(char *)local_a0);
  std::__cxx11::string::~string((string *)local_a0);
  std::operator+(local_100,(char *)&(this->super_builder).compile_dir);
  std::operator+(local_e0,local_100);
  std::operator+(local_c0,(char *)local_e0);
  std::__cxx11::string::~string((string *)local_e0);
  std::__cxx11::string::~string((string *)local_100);
  std::operator+(local_2e0,(char *)&this->compiler);
  std::operator+(local_2c0,local_2e0);
  std::operator+(local_2a0,(char *)local_2c0);
  std::operator+(local_280,local_2a0);
  std::operator+(local_260,(char *)local_280);
  std::operator+(local_240,local_260);
  std::operator+(local_220,(char *)local_240);
  std::operator+(local_200,local_220);
  std::operator+(local_1e0,(char *)local_200);
  std::operator+(local_1c0,local_1e0);
  std::operator+(local_1a0,(char *)local_1c0);
  std::operator+(local_180,(char *)local_1a0);
  std::operator+(local_160,local_180);
  std::operator+(local_140,local_160);
  std::operator+(local_120,(char *)local_140);
  std::__cxx11::string::~string((string *)local_140);
  std::__cxx11::string::~string((string *)local_160);
  std::__cxx11::string::~string((string *)local_180);
  std::__cxx11::string::~string((string *)local_1a0);
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::string::~string((string *)local_1e0);
  std::__cxx11::string::~string((string *)local_200);
  std::__cxx11::string::~string((string *)local_220);
  std::__cxx11::string::~string((string *)local_240);
  std::__cxx11::string::~string((string *)local_260);
  std::__cxx11::string::~string((string *)local_280);
  std::__cxx11::string::~string((string *)local_2a0);
  std::__cxx11::string::~string((string *)local_2c0);
  std::__cxx11::string::~string((string *)local_2e0);
  if (((this->super_builder).verbose & 1U) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"creating per-kernel header");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&compile_start
                 ,(char *)&(this->super_builder).compile_dir);
  std::ofstream::ofstream(local_4e0,&compile_start,0x10);
  std::__cxx11::string::~string((string *)&compile_start);
  poVar1 = std::operator<<(local_4e0,"#pragma once");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_4e0,"#define CPPJIT_EXPORT extern \"C\"");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ofstream::close();
  if (((this->super_builder).verbose & 1U) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"compile_cmd: ");
    poVar1 = std::operator<<(poVar1,(string *)local_120);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  tStack_508.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  local_50c = system(pcVar2);
  if (((this->super_builder).verbose & 1U) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"compile log:");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::operator+(local_550,&(this->super_builder).compile_dir);
    std::operator+(local_530,(char *)local_550);
    builder::read_and_print_log(&this->super_builder,local_530);
    std::__cxx11::string::~string((string *)local_530);
    std::__cxx11::string::~string((string *)local_550);
  }
  if (local_50c != 0) {
    compile_end.__d.__r._6_1_ = 1;
    pcVar3 = (cppjit_exception *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_570,"error: compilation of kernel failed",
               (allocator *)((long)&compile_end.__d.__r + 7));
    cppjit_exception::cppjit_exception(pcVar3,(string *)local_570);
    compile_end.__d.__r._6_1_ = 0;
    __cxa_throw(pcVar3,&cppjit_exception::typeinfo,cppjit_exception::~cppjit_exception);
  }
  compile_duration = (double)std::chrono::_V2::system_clock::now();
  local_598.__r =
       (rep_conflict)
       std::chrono::operator-
                 ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   *)&compile_duration,&stack0xfffffffffffffaf8);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1l>> *)&local_590,&local_598);
  local_588 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_590);
  if (((this->super_builder).verbose & 1U) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"compile duration: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_588);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&link_start,
                 (char *)&this->linker);
  std::operator+(local_738,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&link_start);
  std::operator+(local_718,(char *)local_738);
  std::operator+(local_6f8,local_718);
  std::operator+(local_6d8,(char *)local_6f8);
  std::operator+(local_6b8,local_6d8);
  std::operator+(local_698,(char *)local_6b8);
  std::operator+(local_678,local_698);
  std::operator+(local_658,(char *)local_678);
  std::operator+(local_638,local_658);
  std::operator+(local_618,(char *)local_638);
  std::operator+(local_5f8,local_618);
  std::operator+(local_5d8,local_5f8);
  std::operator+(local_5b8,(char *)local_5d8);
  std::__cxx11::string::~string((string *)local_5d8);
  std::__cxx11::string::~string((string *)local_5f8);
  std::__cxx11::string::~string((string *)local_618);
  std::__cxx11::string::~string((string *)local_638);
  std::__cxx11::string::~string((string *)local_658);
  std::__cxx11::string::~string((string *)local_678);
  std::__cxx11::string::~string((string *)local_698);
  std::__cxx11::string::~string((string *)local_6b8);
  std::__cxx11::string::~string((string *)local_6d8);
  std::__cxx11::string::~string((string *)local_6f8);
  std::__cxx11::string::~string((string *)local_718);
  std::__cxx11::string::~string((string *)local_738);
  std::__cxx11::string::~string((string *)&link_start);
  if (((this->super_builder).verbose & 1U) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"link_cmd: ");
    poVar1 = std::operator<<(poVar1,(string *)local_5b8);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  local_760.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  local_50c = system(pcVar2);
  if (((this->super_builder).verbose & 1U) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"link log:");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::operator+(local_7a0,&(this->super_builder).compile_dir);
    std::operator+(local_780,(char *)local_7a0);
    builder::read_and_print_log(&this->super_builder,local_780);
    std::__cxx11::string::~string((string *)local_780);
    std::__cxx11::string::~string((string *)local_7a0);
  }
  if (local_50c != 0) {
    link_end.__d.__r._6_1_ = 1;
    pcVar3 = (cppjit_exception *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_7c0,"error: compile of kernel failed",
               (allocator *)((long)&link_end.__d.__r + 7));
    cppjit_exception::cppjit_exception(pcVar3,(string *)local_7c0);
    link_end.__d.__r._6_1_ = 0;
    __cxa_throw(pcVar3,&cppjit_exception::typeinfo,cppjit_exception::~cppjit_exception);
  }
  link_duration = (double)std::chrono::_V2::system_clock::now();
  local_7e8.__r =
       (rep_conflict)
       std::chrono::operator-
                 ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   *)&link_duration,&local_760);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1l>> *)&local_7e0,&local_7e8);
  local_7d8 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_7e0);
  if (((this->super_builder).verbose & 1U) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"link duration: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_7d8);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  pvVar4 = builder::load_kernel(&this->super_builder);
  std::__cxx11::string::~string((string *)local_5b8);
  std::ofstream::~ofstream(local_4e0);
  std::__cxx11::string::~string((string *)local_120);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)local_30);
  return pvVar4;
}

Assistant:

void *compile_impl() override {
    // std::string kernel_source_dir = kernel_compile_dir;
    std::string source_file(source_dir + kernel_name + ".cpp");
    std::string object_file(compile_dir + kernel_name + ".o");
    std::string library_file(compile_dir + "lib" + kernel_name + ".so");
    // add compile dir as special include path for dynamically generated headers
    std::string compile_cmd(compiler + " -o " + object_file + " -c " +
                            cpp_flags + " " + include_paths + " -I" +
                            compile_dir + " " + source_file + " " +
                            " > " +
                            compile_dir + kernel_name + "_compile.log 2>&1");

    if (verbose) {
      std::cout << "creating per-kernel header" << std::endl;
    }

    std::ofstream kernel_header_file(compile_dir + "cppjit_kernel.hpp");
    kernel_header_file << "#pragma once" << std::endl;
    kernel_header_file << "#define CPPJIT_EXPORT extern \"C\"" << std::endl;
    kernel_header_file.close();

    if (verbose) {
      std::cout << "compile_cmd: " << compile_cmd << std::endl;
    }
    std::chrono::high_resolution_clock::time_point compile_start =
        std::chrono::high_resolution_clock::now();
    int return_value = std::system(compile_cmd.c_str());
    if (verbose) {
      std::cout << "compile log:" << std::endl;
      read_and_print_log(compile_dir + kernel_name + "_compile.log");
    }
    if (return_value != 0) {
      throw cppjit_exception("error: compilation of kernel failed");
    }

    std::chrono::high_resolution_clock::time_point compile_end =
        std::chrono::high_resolution_clock::now();
    double compile_duration =
        std::chrono::duration<double>(compile_end - compile_start).count();
    if (verbose) {
      std::cout << "compile duration: " << compile_duration << std::endl;
    }

    std::string link_cmd(linker + " " + link_flags + " -o " + library_file +
                         " " + object_file + " " + library_paths + " " + libraries + " > " + compile_dir + kernel_name +
                         "_link.log 2>&1");
    if (verbose) {
      std::cout << "link_cmd: " << link_cmd << std::endl;
    }
    std::chrono::high_resolution_clock::time_point link_start =
        std::chrono::high_resolution_clock::now();
    return_value = std::system(link_cmd.c_str());
    if (verbose) {
      std::cout << "link log:" << std::endl;
      read_and_print_log(compile_dir + kernel_name + "_link.log");
    }
    if (return_value != 0) {
      throw cppjit_exception("error: compile of kernel failed");
    }
    std::chrono::high_resolution_clock::time_point link_end =
        std::chrono::high_resolution_clock::now();
    double link_duration =
        std::chrono::duration<double>(link_end - link_start).count();
    if (verbose) {
      std::cout << "link duration: " << link_duration << std::endl;
    }
    return this->load_kernel();
  }